

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::deinitTestDescriptor
          (TessellationShaderTessellationgl_TessCoord *this,_test_descriptor *test)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  _test_descriptor *test_local;
  TessellationShaderTessellationgl_TessCoord *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (test->po_id != 0) {
    (**(code **)(lVar3 + 0x448))(test->po_id);
    test->po_id = 0;
  }
  if (test->tc_id != 0) {
    (**(code **)(lVar3 + 0x470))(test->tc_id);
    test->tc_id = 0;
  }
  if (test->te_id != 0) {
    (**(code **)(lVar3 + 0x470))(test->te_id);
    test->te_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::deinitTestDescriptor(_test_descriptor& test)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (test.po_id != 0)
	{
		gl.deleteProgram(test.po_id);

		test.po_id = 0;
	}

	if (test.tc_id != 0)
	{
		gl.deleteShader(test.tc_id);

		test.tc_id = 0;
	}

	if (test.te_id != 0)
	{
		gl.deleteShader(test.te_id);

		test.te_id = 0;
	}
}